

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemImpl.cpp
# Opt level: O1

FileInfoMap *
efsw::Platform::FileSystem::filesInfoFromPath(FileInfoMap *__return_storage_ptr__,string *path)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  DIR *__dirp;
  dirent *pdVar3;
  size_t sVar4;
  mapped_type *this;
  char *__s1;
  string name;
  string fpath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  FileInfo local_78;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  __dirp = opendir((path->_M_dataplus)._M_p);
  if (__dirp != (DIR *)0x0) {
    while (pdVar3 = readdir(__dirp), pdVar3 != (dirent *)0x0) {
      __s1 = pdVar3->d_name;
      iVar2 = strcmp(__s1,"..");
      if ((iVar2 != 0) && (iVar2 = strcmp(__s1,"."), iVar2 != 0)) {
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        sVar4 = strlen(__s1);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,__s1,__s1 + sVar4);
        std::operator+(&local_98,path,&local_b8);
        FileInfo::FileInfo(&local_78,&local_98);
        this = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
               ::operator[](__return_storage_ptr__,&local_b8);
        FileInfo::operator=(this,&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78.Filepath._M_dataplus._M_p != &local_78.Filepath.field_2) {
          operator_delete(local_78.Filepath._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p);
        }
      }
    }
    closedir(__dirp);
  }
  return __return_storage_ptr__;
}

Assistant:

FileInfoMap FileSystem::filesInfoFromPath( const std::string& path ) {
	FileInfoMap files;

	DIR* dp;
	struct dirent* dirp;

	if ( ( dp = opendir( path.c_str() ) ) == NULL )
		return files;

	while ( ( dirp = readdir( dp ) ) != NULL ) {
		if ( strcmp( dirp->d_name, ".." ) != 0 && strcmp( dirp->d_name, "." ) != 0 ) {
			std::string name( dirp->d_name );
			std::string fpath( path + name );

			files[name] = FileInfo( fpath );
		}
	}

	closedir( dp );

	return files;
}